

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O3

void __thiscall cmGraphVizWriter::Write(cmGraphVizWriter *this)

{
  _Rb_tree_header *p_Var1;
  cmGlobalGenerator *pcVar2;
  _Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_> _Var3;
  undefined8 *puVar4;
  cmGeneratorTarget *t;
  cmLinkItem *pcVar5;
  undefined1 auVar6 [8];
  bool bVar7;
  string *name;
  _Rb_tree_node_base *p_Var8;
  mapped_type *pmVar9;
  _Base_ptr p_Var10;
  undefined8 uVar11;
  pointer *__ptr;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *gt;
  undefined8 *puVar12;
  cmLinkItem *pcVar13;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *lg;
  pointer puVar14;
  cmLinkItem *rootItem;
  cmLinkItem item;
  set<const_cmGeneratorTarget_*,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<const_cmGeneratorTarget_*>_>
  sortedGeneratorTargets;
  undefined1 local_128 [8];
  _Base_ptr *local_120;
  _Base_ptr local_110 [2];
  undefined1 local_100 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  cmGeneratorTarget *local_e0;
  cmSourceFile *local_d8;
  _Alloc_hider local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  string local_98;
  pointer local_78;
  undefined1 local_70 [16];
  undefined1 local_60 [48];
  
  pcVar2 = this->GlobalGenerator;
  (*pcVar2->_vptr_cmGlobalGenerator[3])(local_100,pcVar2);
  (*(this->super_cmLinkItemGraphVisitor)._vptr_cmLinkItemGraphVisitor[2])(this,local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._0_8_ != &local_f0) {
    operator_delete((void *)local_100._0_8_,local_f0._M_allocated_capacity + 1);
  }
  local_60._24_8_ = local_60 + 8;
  local_60._8_4_ = _S_red;
  local_60._16_8_ = (pointer)0x0;
  local_60._40_8_ = 0;
  puVar14 = (pcVar2->LocalGenerators).
            super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_78 = (pcVar2->LocalGenerators).
             super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_60._32_8_ = local_60._24_8_;
  if (puVar14 != local_78) {
    do {
      _Var3.super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl =
           (puVar14->_M_t).
           super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
           super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
           super__Head_base<0UL,_cmLocalGenerator_*,_false>;
      puVar4 = *(undefined8 **)
                ((long)_Var3.super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl + 0x150);
      for (puVar12 = *(undefined8 **)
                      ((long)_Var3.super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl +
                      0x148); puVar12 != puVar4; puVar12 = puVar12 + 1) {
        name = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)*puVar12);
        bVar7 = cmGlobalGenerator::IsReservedTarget(name);
        if (!bVar7) {
          local_100._0_8_ = *puVar12;
          std::
          _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,cmGeneratorTarget::StrictTargetComparison,std::allocator<cmGeneratorTarget_const*>>
          ::_M_insert_unique<cmGeneratorTarget_const*>
                    ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,cmGeneratorTarget::StrictTargetComparison,std::allocator<cmGeneratorTarget_const*>>
                      *)local_60,(cmGeneratorTarget **)local_100);
        }
      }
      puVar14 = puVar14 + 1;
    } while (puVar14 != local_78);
    if ((_Rb_tree_node_base *)local_60._24_8_ != (_Rb_tree_node_base *)(local_60 + 8)) {
      p_Var8 = (_Rb_tree_node_base *)local_60._24_8_;
      do {
        t = *(cmGeneratorTarget **)(p_Var8 + 1);
        cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_70);
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,cmLinkItem::DEFAULT_abi_cxx11_._M_dataplus._M_p,
                   cmLinkItem::DEFAULT_abi_cxx11_._M_dataplus._M_p +
                   cmLinkItem::DEFAULT_abi_cxx11_._M_string_length);
        cmLinkItem::cmLinkItem
                  ((cmLinkItem *)local_100,t,false,(cmListFileBacktrace *)local_70,&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((cmMakefile *)local_70._8_8_ != (cmMakefile *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
        }
        cmLinkItemGraphVisitor::VisitItem
                  (&this->super_cmLinkItemGraphVisitor,(cmLinkItem *)local_100);
        if (local_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_p != local_c0) {
          operator_delete(local_d0._M_p,(ulong)(local_c0[0]._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._0_8_ != &local_f0) {
          operator_delete((void *)local_100._0_8_,local_f0._M_allocated_capacity + 1);
        }
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
      } while (p_Var8 != (_Rb_tree_node_base *)(local_60 + 8));
    }
  }
  if (this->GeneratePerTarget != false) {
    local_120 = local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"");
    local_f0._8_8_ = local_100 + 8;
    local_100._8_4_ = _S_red;
    local_f0._M_allocated_capacity = 0;
    local_d8 = (cmSourceFile *)0x0;
    p_Var10 = (this->PerTargetConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->PerTargetConnections)._M_t._M_impl.super__Rb_tree_header;
    local_e0 = (cmGeneratorTarget *)local_f0._8_8_;
    if ((_Rb_tree_header *)p_Var10 != p_Var1) {
      do {
        pmVar9 = std::
                 map<cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>_>
                 ::operator[]((map<cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>_>
                               *)local_100,(key_type *)(p_Var10 + 1));
        FindAllConnections(this,&this->PerTargetConnections,(key_type *)(p_Var10 + 1),pmVar9);
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
      } while ((_Rb_tree_header *)p_Var10 != p_Var1);
      uVar11 = local_f0._8_8_;
      if ((_Rb_tree_node_base *)local_f0._8_8_ != (_Rb_tree_node_base *)(local_100 + 8)) {
        do {
          bVar7 = ItemExcluded(this,(cmLinkItem *)(uVar11 + 0x20));
          if (!bVar7) {
            CreateTargetFile((cmGraphVizWriter *)local_128,(cmLinkItem *)this,
                             (string *)(uVar11 + 0x20));
            pcVar5 = (cmLinkItem *)((_Rb_tree_node_base *)(uVar11 + 0x80))->_M_left;
            for (pcVar13 = (cmLinkItem *)((_Rb_tree_node_base *)(uVar11 + 0x80))->_M_parent;
                auVar6 = local_128, pcVar13 != pcVar5; pcVar13 = (cmLinkItem *)&pcVar13[2].Target) {
              WriteNode(this,(cmGeneratedFileStream *)local_128,pcVar13 + 1);
              WriteConnection(this,(cmGeneratedFileStream *)local_128,pcVar13,pcVar13 + 1,
                              &pcVar13[2].String);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_128,"}\n",2);
            (*(((ofstream *)auVar6)->super_basic_ostream<char,_std::char_traits<char>_>).
              _vptr_basic_ostream[1])(auVar6);
          }
          uVar11 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar11);
        } while ((_Rb_tree_node_base *)uVar11 != (_Rb_tree_node_base *)(local_100 + 8));
      }
    }
    std::
    _Rb_tree<cmLinkItem,_std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>,_std::_Select1st<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<cmLinkItem,_std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>,_std::_Select1st<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>_>
                 *)local_100);
    if (local_120 != local_110) {
      operator_delete(local_120,(ulong)((long)&local_110[0]->_M_color + 1));
    }
  }
  if (this->GenerateDependers == true) {
    local_120 = local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,".dependers","");
    local_f0._8_8_ = local_100 + 8;
    local_100._8_4_ = _S_red;
    local_f0._M_allocated_capacity = 0;
    local_d8 = (cmSourceFile *)0x0;
    p_Var10 = (this->TargetDependersConnections)._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_left;
    p_Var1 = &(this->TargetDependersConnections)._M_t._M_impl.super__Rb_tree_header;
    local_e0 = (cmGeneratorTarget *)local_f0._8_8_;
    if ((_Rb_tree_header *)p_Var10 != p_Var1) {
      do {
        pmVar9 = std::
                 map<cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>_>
                 ::operator[]((map<cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>_>
                               *)local_100,(key_type *)(p_Var10 + 1));
        FindAllConnections(this,&this->TargetDependersConnections,(key_type *)(p_Var10 + 1),pmVar9);
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
      } while ((_Rb_tree_header *)p_Var10 != p_Var1);
      uVar11 = local_f0._8_8_;
      if ((_Rb_tree_node_base *)local_f0._8_8_ != (_Rb_tree_node_base *)(local_100 + 8)) {
        do {
          bVar7 = ItemExcluded(this,(cmLinkItem *)(uVar11 + 0x20));
          if (!bVar7) {
            CreateTargetFile((cmGraphVizWriter *)local_128,(cmLinkItem *)this,
                             (string *)(uVar11 + 0x20));
            pcVar5 = (cmLinkItem *)((_Rb_tree_node_base *)(uVar11 + 0x80))->_M_left;
            for (pcVar13 = (cmLinkItem *)((_Rb_tree_node_base *)(uVar11 + 0x80))->_M_parent;
                auVar6 = local_128, pcVar13 != pcVar5; pcVar13 = (cmLinkItem *)&pcVar13[2].Target) {
              WriteNode(this,(cmGeneratedFileStream *)local_128,pcVar13 + 1);
              WriteConnection(this,(cmGeneratedFileStream *)local_128,pcVar13 + 1,pcVar13,
                              &pcVar13[2].String);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_128,"}\n",2);
            (*(((ofstream *)auVar6)->super_basic_ostream<char,_std::char_traits<char>_>).
              _vptr_basic_ostream[1])(auVar6);
          }
          uVar11 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar11);
        } while ((_Rb_tree_node_base *)uVar11 != (_Rb_tree_node_base *)(local_100 + 8));
      }
    }
    std::
    _Rb_tree<cmLinkItem,_std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>,_std::_Select1st<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<cmLinkItem,_std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>,_std::_Select1st<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>_>
                 *)local_100);
    if (local_120 != local_110) {
      operator_delete(local_120,(ulong)((long)&local_110[0]->_M_color + 1));
    }
  }
  std::
  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<const_cmGeneratorTarget_*>_>
  ::~_Rb_tree((_Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<const_cmGeneratorTarget_*>_>
               *)local_60);
  return;
}

Assistant:

void cmGraphVizWriter::Write()
{
  const auto* gg = this->GlobalGenerator;

  this->VisitGraph(gg->GetName());

  // We want to traverse in a determined order, such that the output is always
  // the same for a given project (this makes tests reproducible, etc.)
  std::set<cmGeneratorTarget const*, cmGeneratorTarget::StrictTargetComparison>
    sortedGeneratorTargets;

  for (const auto& lg : gg->GetLocalGenerators()) {
    for (const auto& gt : lg->GetGeneratorTargets()) {
      // Reserved targets have inconsistent names across platforms (e.g. 'all'
      // vs. 'ALL_BUILD'), which can disrupt the traversal ordering.
      // We don't need or want them anyway.
      if (!cmGlobalGenerator::IsReservedTarget(gt->GetName())) {
        sortedGeneratorTargets.insert(gt.get());
      }
    }
  }

  // write global data and collect all connection data for per target graphs
  for (const auto* const gt : sortedGeneratorTargets) {
    auto item = cmLinkItem(gt, false, gt->GetBacktrace());
    this->VisitItem(item);
  }

  if (this->GeneratePerTarget) {
    this->WritePerTargetConnections<DependeesDir>(this->PerTargetConnections);
  }

  if (this->GenerateDependers) {
    this->WritePerTargetConnections<DependersDir>(
      this->TargetDependersConnections, ".dependers");
  }
}